

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_coordinator_unittest.cpp
# Opt level: O2

void __thiscall
HostCoordinator_refrange_alloc_free_Test::TestBody(HostCoordinator_refrange_alloc_free_Test *this)

{
  AssertHelperData *__ptr;
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  AssertionResult gtest_ar;
  
  __ptr = (AssertHelperData *)memory::impl::aligned_malloc<char,8ul>(0x14);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_ = __ptr;
  testing::internal::CmpHelperNE<float*,float*>
            ((internal *)&gtest_ar,"rrng_t::pointer(0)","rrng.data()",(float **)&local_28,
             (float **)&local_20);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    std::operator<<((ostream *)(local_28.ptr_ + 0x10),
                    "HostCoordinator returned a NULL pointer when allocating a nonzero range");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr;
  local_20.data_ = __ptr;
  testing::internal::CmpHelperEQ<float*,float*>
            ((internal *)&gtest_ar,"rng.data()","rrng.data()",(float **)&local_28,
             (float **)&local_20);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    std::operator<<((ostream *)(local_28.ptr_ + 0x10),
                    "base(all) does not have the same pointer address as base");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  free(__ptr);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<float*,float*>
            ((internal *)&gtest_ar,"rng_t::pointer(0)","rng.data()",(float **)&local_28,
             (float **)&local_20);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x58,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"rng_t::size_type(0)","rng.size()",(unsigned_long *)&local_28,
             (unsigned_long *)&local_20);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x59,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HostCoordinator, refrange_alloc_free) {
    using namespace memory;

    typedef HostCoordinator<float> floatcoord_t;
    floatcoord_t coordinator;

    auto rng = coordinator.allocate(5);
    typedef decltype(rng) rng_t;

    auto rrng = rng(all);
    typedef decltype(rrng) rrng_t;

    // test that range has correct storage type
    ::testing::StaticAssertTypeEq<float, rrng_t::value_type >();

    // verify that the range has non-NULL pointer
    EXPECT_NE(rrng_t::pointer(0), rrng.data())
        << "HostCoordinator returned a NULL pointer when allocating a nonzero range";

    EXPECT_EQ(rng.data(), rrng.data())
        << "base(all) does not have the same pointer address as base";

    // verify that freeing works
    coordinator.free(rng);

    EXPECT_EQ(rng_t::pointer(0),   rng.data());
    EXPECT_EQ(rng_t::size_type(0), rng.size());
}